

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

gdImagePtr gdImageCreate(int sx,int sy)

{
  int iVar1;
  gdImagePtr ptr;
  uchar **ppuVar2;
  uchar *puVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  iVar1 = overflow2(sx,sy);
  if ((((iVar1 == 0) && (iVar1 = overflow2(8,sy), iVar1 == 0)) &&
      (iVar1 = overflow2(1,sx), iVar1 == 0)) &&
     (ptr = (gdImagePtr)gdCalloc(1,0x1ca8), ptr != (gdImagePtr)0x0)) {
    ppuVar2 = (uchar **)gdMalloc((long)sy << 3);
    ptr->pixels = ppuVar2;
    if (ppuVar2 != (uchar **)0x0) {
      ptr->polyInts = (int *)0x0;
      ptr->polyAllocated = 0;
      ptr->style = (int *)0x0;
      ptr->brush = (gdImageStruct *)0x0;
      ptr->tile = (gdImageStruct *)0x0;
      if (sy < 1) {
LAB_0010adfa:
        ptr->sx = sx;
        ptr->sy = sy;
        ptr->colorsTotal = 0;
        ptr->transparent = -1;
        ptr->interlace = 0;
        ptr->thick = 1;
        ptr->AA = 0;
        lVar4 = 0x305;
        do {
          ptr->red[lVar4 + -5] = 1;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x405);
        ptr->trueColor = 0;
        ptr->tpixels = (int **)0x0;
        ptr->cx1 = 0;
        ptr->cy1 = 0;
        ptr->cx2 = ptr->sx + -1;
        ptr->cy2 = ptr->sy + -1;
        ptr->res_x = 0x60;
        ptr->res_y = 0x60;
        ptr->interpolation = (interpolation_method)0x0;
        ptr->interpolation_id = GD_BILINEAR_FIXED;
        return ptr;
      }
      uVar5 = 1;
LAB_0010adc6:
      puVar3 = (uchar *)gdCalloc((long)sx,1);
      ptr->pixels[uVar5 - 1] = puVar3;
      if (ptr->pixels[uVar5 - 1] != (uchar *)0x0) goto code_r0x0010adea;
      if (uVar5 != 1) {
        do {
          gdFree(ptr->pixels[(int)uVar5 - 2]);
          uVar5 = uVar5 - 1;
        } while (1 < (long)uVar5);
      }
      gdFree(ptr->pixels);
    }
    gdFree(ptr);
  }
  return (gdImagePtr)0x0;
code_r0x0010adea:
  bVar6 = uVar5 == (uint)sy;
  uVar5 = uVar5 + 1;
  if (bVar6) goto LAB_0010adfa;
  goto LAB_0010adc6;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreate (int sx, int sy)
{
	int i;
	gdImagePtr im;

	if (overflow2(sx, sy)) {
		return NULL;
	}

	if (overflow2(sizeof (unsigned char *), sy)) {
		return NULL;
	}
	if (overflow2(sizeof (unsigned char), sx)) {
		return NULL;
	}

	im = (gdImage *) gdCalloc(1, sizeof(gdImage));
	if (!im) {
		return NULL;
	}

	/* Row-major ever since gd 1.3 */
	im->pixels = (unsigned char **) gdMalloc (sizeof (unsigned char *) * sy);
	if (!im->pixels) {
		gdFree(im);
		return NULL;
	}

	im->polyInts = 0;
	im->polyAllocated = 0;
	im->brush = 0;
	im->tile = 0;
	im->style = 0;
	for (i = 0; (i < sy); i++) {
		/* Row-major ever since gd 1.3 */
		im->pixels[i] = (unsigned char *) gdCalloc (sx, sizeof (unsigned char));
		if (!im->pixels[i]) {
			for (--i ; i >= 0; i--) {
				gdFree(im->pixels[i]);
			}
			gdFree(im->pixels);
			gdFree(im);
			return NULL;
		}

	}
	im->sx = sx;
	im->sy = sy;
	im->colorsTotal = 0;
	im->transparent = (-1);
	im->interlace = 0;
	im->thick = 1;
	im->AA = 0;
	for (i = 0; (i < gdMaxColors); i++) {
		im->open[i] = 1;
	};
	im->trueColor = 0;
	im->tpixels = 0;
	im->cx1 = 0;
	im->cy1 = 0;
	im->cx2 = im->sx - 1;
	im->cy2 = im->sy - 1;
	im->res_x = GD_RESOLUTION;
	im->res_y = GD_RESOLUTION;
	im->interpolation = NULL;
	im->interpolation_id = GD_BILINEAR_FIXED;
	return im;
}